

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O3

int32_t __thiscall
charls::context_run_mode::compute_error_value(context_run_mode *this,int32_t temp,int32_t k)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = (temp & 1U) + temp;
  uVar3 = 1;
  if (k == 0) {
    uVar3 = (uint)((uint)this->n_ <= (uint)this->nn_ * 2);
  }
  iVar2 = iVar1 / 2;
  if (uVar3 != (temp & 1U)) {
    if (iVar1 < 2 || k != 0) {
      if (-2 < iVar1) goto LAB_0010ab9b;
      if ((uint)this->nn_ * 2 < (uint)this->n_) {
        if ((k != 0) == (bool)((byte)temp & 1)) {
          return iVar2;
        }
        goto LAB_0010abd0;
      }
    }
    else if ((uint)this->n_ <= (uint)this->nn_ * 2) {
LAB_0010ab9b:
      if ((temp & 1U) == 0) {
        return iVar2;
      }
      goto LAB_0010abd0;
    }
    if ((temp & 1U) != 0) {
      return iVar2;
    }
LAB_0010abd0:
    __assert_fail("map == compute_map(error_value_abs, k)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                  ,0x4f,
                  "int32_t charls::context_run_mode::compute_error_value(const int32_t, const int32_t) const"
                 );
  }
  iVar2 = -iVar2;
  if (iVar1 < -1 && k == 0) {
    if ((uint)this->n_ <= (uint)this->nn_ * 2) {
LAB_0010ab93:
      if ((temp & 1U) == 0) {
        return iVar2;
      }
      goto LAB_0010aba9;
    }
  }
  else {
    if (iVar1 < 2) goto LAB_0010ab93;
    if ((uint)this->nn_ * 2 < (uint)this->n_) {
      if ((k != 0) == (bool)((byte)temp & 1)) {
        return iVar2;
      }
      goto LAB_0010aba9;
    }
  }
  if ((temp & 1U) != 0) {
    return iVar2;
  }
LAB_0010aba9:
  __assert_fail("map == compute_map(-error_value_abs, k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                ,0x4b,
                "int32_t charls::context_run_mode::compute_error_value(const int32_t, const int32_t) const"
               );
}

Assistant:

FORCE_INLINE int32_t compute_error_value(const int32_t temp, const int32_t k) const noexcept
    {
        const bool map = temp & 1;
        const int32_t error_value_abs{(temp + static_cast<int32_t>(map)) / 2};

        if ((k != 0 || (2 * nn_ >= n_)) == map)
        {
            ASSERT(map == compute_map(-error_value_abs, k));
            return -error_value_abs;
        }

        ASSERT(map == compute_map(error_value_abs, k));
        return error_value_abs;
    }